

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

Vec<Hpipe::BranchSet::Range> * __thiscall
Hpipe::Vec<Hpipe::BranchSet::Range>::without
          (Vec<Hpipe::BranchSet::Range> *__return_storage_ptr__,Vec<Hpipe::BranchSet::Range> *this,
          uint index)

{
  size_type sVar1;
  Range *val;
  undefined4 local_30;
  uint i;
  uint index_local;
  Vec<Hpipe::BranchSet::Range> *this_local;
  Vec<Hpipe::BranchSet::Range> *res;
  
  Vec(__return_storage_ptr__);
  sVar1 = std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::size
                    (&this->
                      super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    );
  std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::reserve
            (&__return_storage_ptr__->
              super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>,
             sVar1 - 1);
  for (local_30 = 0;
      sVar1 = std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::size
                        (&this->
                          super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                        ), local_30 < sVar1; local_30 = local_30 + 1) {
    if (local_30 != index) {
      val = operator[](this,local_30);
      operator<<(__return_storage_ptr__,val);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vec      without              ( unsigned index             ) const { Vec res; res.reserve( this->size() - 1   ); for( unsigned i = 0  ; i < this->size(); ++i ) if ( i != index ) res << this->operator[]( i ); return res; }